

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::Solver(Solver *this)

{
  ClauseAllocator *this_00;
  int32_t iVar1;
  uint uVar2;
  OnlineProofChecker *this_01;
  ulong uVar3;
  float fVar4;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_001389b8;
  (this->model).data = (lbool *)0x0;
  (this->model).sz = 0;
  (this->model).cap = 0;
  (this->conflict).data = (Lit *)0x0;
  (this->conflict).sz = 0;
  (this->conflict).cap = 0;
  this->drup_file = (FILE *)0x0;
  updateOptions();
  this_01 = (OnlineProofChecker *)0x0;
  this->reparsed_options = false;
  this->verbosity = 0;
  this->status_every = 100000;
  this->step_size = opt_step_size.value;
  this->step_size_dec = opt_step_size_dec.value;
  this->min_step_size = opt_min_step_size.value;
  iVar1 = opt_var_decay_conflicts.value;
  this->var_decay_timer = opt_var_decay_conflicts.value;
  this->var_decay_timer_init = iVar1;
  this->var_decay = opt_var_decay.value;
  this->clause_decay = opt_clause_decay.value;
  this->random_var_freq = opt_random_var_freq.value;
  this->random_seed = opt_random_seed.value;
  this->ccmin_mode = opt_ccmin_mode.value;
  this->phase_saving = opt_phase_saving.value;
  this->invert_pol = false;
  this->init_act = opt_init_act.value;
  this->garbage_frac = opt_garbage_frac.value;
  this->restart_first = opt_restart_first.value;
  this->restart_inc = opt_restart_inc.value;
  this->learntsize_factor = 0.3333333333333333;
  this->learntsize_inc = 1.1;
  this->learntsize_adjust_start_confl = 100;
  this->learntsize_adjust_inc = 1.5;
  memset(&this->solves,0,0xc4);
  uVar2 = (uint)opt_almost_pure.value;
  this->posMissingInSome = uVar2 ^ 1;
  this->negMissingInSome = uVar2 ^ 1;
  iVar1 = opt_restart_select.value;
  (this->restart).savedDecisions = 0;
  (this->restart).savedPropagations = 0;
  (this->restart).partialRestarts = 0;
  (this->restart).selection_type = iVar1;
  this->VSIDS_conflicts = opt_vsids_c.value;
  this->VSIDS_propagations = opt_vsids_p.value;
  this->reactivate_VSIDS = false;
  (this->statistics).simpSteps = 0;
  (this->statistics).solveSteps = 0;
  (this->statistics).simpSeconds = 0.0;
  (this->statistics).solveSeconds = 0.0;
  this->inprocess_mems = 0;
  this->inprocessings = 0;
  this->inprocessing_C = 0;
  this->inprocessing_L = 0;
  if (opt_checkProofOnline.value != 0) {
    this_01 = (OnlineProofChecker *)operator_new(0x100);
    OnlineProofChecker::OnlineProofChecker(this_01,drupProof);
  }
  this->onlineDratChecker = this_01;
  (this->lazySATwatch).data = (watchItem *)0x0;
  (this->lazySATwatch).sz = 0;
  (this->lazySATwatch).cap = 0;
  this->ok = true;
  (this->clauses).data = (uint *)0x0;
  (this->clauses).sz = 0;
  (this->clauses).cap = 0;
  (this->learnts_core).data = (uint *)0x0;
  (this->learnts_core).sz = 0;
  (this->learnts_core).cap = 0;
  (this->learnts_tier2).data = (uint *)0x0;
  (this->learnts_tier2).sz = 0;
  (this->learnts_tier2).cap = 0;
  (this->learnts_local).data = (uint *)0x0;
  (this->learnts_local).sz = 0;
  (this->learnts_local).cap = 0;
  this->cla_inc = 1.0;
  (this->activity_CHB).data = (double *)0x0;
  (this->activity_CHB).sz = 0;
  (this->activity_CHB).cap = 0;
  (this->activity_VSIDS).data = (double *)0x0;
  (this->activity_VSIDS).sz = 0;
  (this->activity_VSIDS).cap = 0;
  (this->activity_distance).data = (double *)0x0;
  (this->activity_distance).sz = 0;
  (this->activity_distance).cap = 0;
  this->var_inc = 1.0;
  this_00 = &this->ca;
  (this->watches_bin).occs.data = (vec<Minisat::Watcher> *)0x0;
  (this->watches_bin).occs.sz = 0;
  (this->watches_bin).occs.cap = 0;
  (this->watches_bin).dirty.data = (char *)0x0;
  (this->watches_bin).dirty.sz = 0;
  (this->watches_bin).dirty.cap = 0;
  (this->watches_bin).dirties.data = (Lit *)0x0;
  (this->watches_bin).dirties.sz = 0;
  (this->watches_bin).dirties.cap = 0;
  (this->watches_bin).deleted.ca = this_00;
  (this->watches).occs.data = (vec<Minisat::Watcher> *)0x0;
  (this->watches).occs.sz = 0;
  (this->watches).occs.cap = 0;
  (this->watches).dirty.data = (char *)0x0;
  (this->watches).dirty.sz = 0;
  (this->watches).dirty.cap = 0;
  (this->watches).dirties.data = (Lit *)0x0;
  (this->watches).dirties.sz = 0;
  (this->watches).dirties.cap = 0;
  (this->watches).deleted.ca = this_00;
  (this->vardata).data = (VarData *)0x0;
  (this->vardata).sz = 0;
  (this->vardata).cap = 0;
  (this->trail_lim).data = (int *)0x0;
  (this->trail_lim).sz = 0;
  (this->trail_lim).cap = 0;
  (this->trail).data = (Lit *)0x0;
  (this->trail).sz = 0;
  (this->trail).cap = 0;
  (this->decision).data = (char *)0x0;
  (this->decision).sz = 0;
  (this->decision).cap = 0;
  this->qhead = 0;
  (this->polarity).data = (char *)0x0;
  (this->polarity).sz = 0;
  (this->polarity).cap = 0;
  (this->assigns).data = (lbool *)0x0;
  (this->assigns).sz = 0;
  (this->assigns).cap = 0;
  this->use_backuped_trail = opt_use_backuped_trail.value;
  this->old_trail_qhead = 0;
  (this->old_trail).data = (Lit *)0x0;
  (this->old_trail).sz = 0;
  (this->old_trail).cap = 0;
  (this->oldreasons).data = (uint *)0x0;
  (this->oldreasons).sz = 0;
  (this->oldreasons).cap = 0;
  this->simpDB_assigns = -1;
  (this->assumptions).sz = 0;
  (this->assumptions).cap = 0;
  this->simpDB_props = 0;
  (this->assumptions).data = (Lit *)0x0;
  this->current_heuristic = DISTANCE;
  (this->decision_rebuild_vars).data = (int *)0x0;
  (this->decision_rebuild_vars).sz = 0;
  (this->decision_rebuild_vars).cap = 0;
  (this->distance_level_incs).data = (int *)0x0;
  (this->distance_level_incs).sz = 0;
  (this->distance_level_incs).cap = 0;
  (this->order_heap_VSIDS).lt.activity = &this->activity_VSIDS;
  (this->order_heap_VSIDS).heap.data = (int *)0x0;
  (this->order_heap_VSIDS).heap.sz = 0;
  (this->order_heap_VSIDS).heap.cap = 0;
  (this->order_heap_VSIDS).indices.data = (int *)0x0;
  (this->order_heap_VSIDS).indices.sz = 0;
  (this->order_heap_VSIDS).indices.cap = 0;
  (this->order_heap_CHB).lt.activity = &this->activity_CHB;
  (this->order_heap_CHB).heap.data = (int *)0x0;
  (this->order_heap_CHB).heap.sz = 0;
  (this->order_heap_CHB).heap.cap = 0;
  (this->order_heap_CHB).indices.data = (int *)0x0;
  (this->order_heap_CHB).indices.sz = 0;
  (this->order_heap_CHB).indices.cap = 0;
  (this->order_heap_DISTANCE).lt.activity = &this->activity_distance;
  (this->order_heap_DISTANCE).indices.data = (int *)0x0;
  (this->order_heap_DISTANCE).indices.sz = 0;
  (this->order_heap_DISTANCE).indices.cap = 0;
  (this->order_heap_DISTANCE).heap.data = (int *)0x0;
  (this->order_heap_DISTANCE).heap.sz = 0;
  (this->order_heap_DISTANCE).heap.cap = 0;
  this->order_heap = &this->order_heap_DISTANCE;
  this->max_activity_bump_size = opt_max_activity_bump_size.value;
  this->max_lbd_calc_size = opt_max_lbd_calc_size.value;
  this->full_heap_size = -1;
  this->progress_estimate = 0.0;
  this->remove_satisfied = true;
  this->check_satisfiability = opt_check_sat.value;
  this->check_satisfiability_simplified = false;
  (this->satChecker).check_formula.data = (Lit *)0x0;
  (this->satChecker).check_formula.sz = 0;
  (this->satChecker).check_formula.cap = 0;
  (this->learnt_clause).data = (Lit *)0x0;
  (this->learnt_clause).sz = 0;
  (this->learnt_clause).cap = 0;
  this->core_lbd_cut = 3;
  this->core_size_lim = opt_core_size_lim.value;
  this->core_size_lim_inc = (float)opt_core_size_lim_inc.value;
  this->global_lbd_sum = 0.0;
  this->lbd_avg_compare_limit = (float)opt_lbd_avg_compare_limit.value;
  MyQueue<int>::MyQueue(&this->lbd_queue,0x32);
  this->next_T2_reduce = 10000;
  this->next_L_reduce = 15000;
  ClauseAllocator::ClauseAllocator(this_00);
  this->confl_to_chrono = (long)opt_conf_to_chrono.value;
  this->chrono = (long)opt_chrono.value;
  this->termCallbackState = (void *)0x0;
  this->termCallback = (_func_int_void_ptr *)0x0;
  this->learnCallbackState = (void *)0x0;
  (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->learnCallbackLimit = 0;
  memset(&this->learnCallback,0,0xa8);
  this->inprocess_next_lim = (long)opt_inprocessing_init_delay.value;
  this->L = 0;
  this->inprocess_learnt_level = opt_inprocess_learnt_level.value;
  this->inprocess_inc = opt_inprocessing_inc.value;
  this->inprocess_penalty = opt_inprocessing_penalty.value;
  this->learntsize_adjust_cnt = 0;
  this->max_learnts = 0.0;
  this->learntsize_adjust_confl = 0.0;
  this->VSIDS_props_limit = opt_VSIDS_props_limit.value;
  this->VSIDS_props_init_limit = opt_VSIDS_props_init_limit.value;
  this->switch_mode = false;
  *(undefined4 *)&this->conflict_budget = 0xffffffff;
  *(undefined4 *)((long)&this->conflict_budget + 4) = 0xffffffff;
  *(undefined4 *)&this->propagation_budget = 0xffffffff;
  *(undefined4 *)((long)&this->propagation_budget + 4) = 0xffffffff;
  this->asynch_interrupt = false;
  this->prefetch_assumptions = opt_pref_assumpts.value;
  this->last_used_assumptions = 0x7fffffff;
  this->buf_len = 0;
  this->buf_ptr = drup_buf;
  (this->check_hit_vec).data = (char *)0x0;
  (this->check_hit_vec).sz = 0;
  (this->check_hit_vec).cap = 0;
  this->trailRecord = 0;
  *(undefined1 (*) [16])&(this->simp_learnt_clause).sz = (undefined1  [16])0x0;
  this->nr_lcm_duplicates = 0;
  (this->simp_learnt_clause).data = (Lit *)0x0;
  this->original_length_record = 0;
  this->s_propagations = 0;
  this->nbSimplifyAll = 0;
  this->simplified_length_record = 0;
  (this->simp_reason_clause).sz = 0;
  (this->simp_reason_clause).cap = 0;
  ClauseRingBuffer::ClauseRingBuffer(&this->simplifyBuffer,opt_dup_buffer_size.value);
  this->share_parallel = true;
  this->receiveClauses = true;
  this->share_clause_max_size = 0x40;
  this->receivedCls = 0;
  this->learnedClsCallback = (_func_void_vector<int,_std::allocator<int>_>_ptr_int_void_ptr *)0x0;
  this->lastDecision = 0;
  this->consumeSharedCls = (_func_void_void_ptr *)0x0;
  this->issuer = (void *)0x0;
  this->curSimplify = 1;
  this->nbconfbeforesimplify = (long)opt_lcm_delay.value;
  this->incSimplify = opt_lcm_delay_inc.value;
  this->lcm = opt_lcm.value;
  this->reverse_LCM = opt_reverse_lcm.value;
  this->lcm_core = opt_lcm_core.value;
  this->lcm_core_success = true;
  this->LCM_total_tries = 0;
  this->LCM_successful_tries = 0;
  this->LCM_dropped_lits = 0;
  this->LCM_dropped_reverse = 0;
  (this->var_iLevel).data = (double *)0x0;
  (this->var_iLevel).sz = 0;
  (this->var_iLevel).cap = 0;
  (this->var_iLevel_tmp).data = (double *)0x0;
  (this->var_iLevel_tmp).sz = 0;
  (this->var_iLevel_tmp).cap = 0;
  this->nbcollectfirstuip = 0;
  this->nblearntclause = 0;
  this->nbDoubleConflicts = 0;
  this->nbTripleConflicts = 0;
  this->uip1 = 0;
  this->uip2 = 0;
  (this->pathCs).data = (int *)0x0;
  (this->pathCs).sz = 0;
  (this->pathCs).cap = 0;
  this->var_iLevel_inc = 1.0;
  (this->involved_lits).data = (Lit *)0x0;
  (this->involved_lits).sz = 0;
  (this->involved_lits).cap = 0;
  this->my_var_decay = 0.6;
  this->use_ccnr = opt_use_ccnr.value;
  this->allow_rephasing = opt_allow_rephasing.value;
  this->restarts_gap = opt_ccnr_restarts_gap.value;
  fVar4 = (float)opt_ccnr_percent_ratio.value;
  this->conflict_ratio = (float)opt_ccnr_conflict_ratio.value;
  this->percent_ratio = fVar4;
  this->up_time_ratio = (float)opt_ccnr_up_time_ratio.value;
  this->ls_mems_num = (long)opt_ccnr_ls_mems_num.value;
  this->state_change_time = (long)opt_ccnr_state_change_time.value;
  this->state_change_time_inc = (double)opt_ccnr_state_change_time_inc.value;
  this->state_change_time_inc_inc = opt_ccnr_state_change_time_inc_inc.value;
  uVar3 = (ulong)opt_ccnr_mediation_used.value;
  this->mediation_used = opt_ccnr_mediation_used.value;
  this->switch_heristic_mod = uVar3;
  this->last_switch_conflicts = 0;
  this->sls_var_lim = opt_sls_var_lim.value;
  this->sls_clause_lim = opt_sls_clause_lim.value;
  CCNR::ls_solver::ls_solver(&this->ccnr);
  this->freeze_ls_restart_num = 0;
  this->ls_used_time = 0.0;
  this->ls_call_num = 0;
  this->ls_best_unsat_num = 0x7fffffff;
  this->solved_by_ls = false;
  this->initial_sls = opt_sls_initial.value;
  this->use_sls_phase = true;
  this->max_trail = 0;
  this->called_initial_sls = false;
  *(undefined1 (*) [16])&this->solve_starts = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->ls_best_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->ls_best_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = (undefined1  [16])0x0;
  (this->top_trail_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->top_trail_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((opt_checkProofOnline.value != 0) && (this->onlineDratChecker != (OnlineProofChecker *)0x0)) {
    this->onlineDratChecker->verbose = opt_checkProofOnline.value;
  }
  return;
}

Assistant:

Solver::Solver()
  :

  // Parameters (user settable):
  //
  drup_file(NULL)
  , reparsed_options(updateOptions())
  , verbosity(0)
  , status_every(100000)
  , step_size(opt_step_size)
  , step_size_dec(opt_step_size_dec)
  , min_step_size(opt_min_step_size)
  , var_decay_timer(opt_var_decay_conflicts)
  , var_decay_timer_init(opt_var_decay_conflicts)
  , var_decay(opt_var_decay)
  , clause_decay(opt_clause_decay)
  , random_var_freq(opt_random_var_freq)
  , random_seed(opt_random_seed)
  , ccmin_mode(opt_ccmin_mode)
  , phase_saving(opt_phase_saving)
  , invert_pol(false)
  , init_act(opt_init_act)
  , garbage_frac(opt_garbage_frac)
  , restart_first(opt_restart_first)
  , restart_inc(opt_restart_inc)

  // Parameters (the rest):
  //
  , learntsize_factor((double)1 / (double)3)
  , learntsize_inc(1.1)

  // Parameters (experimental):
  //
  , learntsize_adjust_start_confl(100)
  , learntsize_adjust_inc(1.5)

  // Statistics: (formerly in 'SolverStats')
  //
  , solves(0)
  , starts(0)
  , decisions(0)
  , rnd_decisions(0)
  , propagations(0)
  , conflicts(0)
  , conflicts_VSIDS(0)
  , dec_vars(0)
  , clauses_literals(0)
  , learnts_literals(0)
  , max_literals(0)
  , tot_literals(0)
  , chrono_backtrack(0)
  , non_chrono_backtrack(0)
  , backuped_trail_lits(0)
  , used_backup_lits(0)

  , systematic_branching_state(0)
  , posMissingInSome(opt_almost_pure ? 0 : 1)
  , negMissingInSome(opt_almost_pure ? 0 : 1)

  , restart(opt_restart_select)

  , VSIDS_conflicts(opt_vsids_c)
  , VSIDS_propagations(opt_vsids_p)
  , reactivate_VSIDS(false)

  , inprocessing_C(0)
  , inprocessing_L(0)
  , inprocess_mems(0)
  , inprocessings(0)

  , onlineDratChecker(opt_checkProofOnline != 0 ? new OnlineProofChecker(drupProof) : 0)

  , ok(true)
  , cla_inc(1)
  , var_inc(1)
  , watches_bin(WatcherDeleted(ca))
  , watches(WatcherDeleted(ca))
  , qhead(0)
  , use_backuped_trail(opt_use_backuped_trail)
  , old_trail_qhead(0)
  , simpDB_assigns(-1)
  , simpDB_props(0)
  , current_heuristic(DISTANCE)
  , order_heap_VSIDS(VarOrderLt(activity_VSIDS))
  , order_heap_CHB(VarOrderLt(activity_CHB))
  , order_heap_DISTANCE(VarOrderLt(activity_distance))
  , order_heap(&order_heap_DISTANCE)
  , max_activity_bump_size(opt_max_activity_bump_size)
  , max_lbd_calc_size(opt_max_lbd_calc_size)
  , full_heap_size(-1)
  , progress_estimate(0)
  , remove_satisfied(true)
  , check_satisfiability(opt_check_sat)
  , check_satisfiability_simplified(false)

  , core_lbd_cut(3)
  , core_size_lim(opt_core_size_lim)
  , core_size_lim_inc(opt_core_size_lim_inc)
  , global_lbd_sum(0)
  , lbd_avg_compare_limit(opt_lbd_avg_compare_limit)
  , lbd_queue(50)
  , next_T2_reduce(10000)
  , next_L_reduce(15000)
  , confl_to_chrono(opt_conf_to_chrono)
  , chrono(opt_chrono)

  , termCallbackState(0)
  , termCallback(0)
  , learnCallbackState(0)
  , learnCallbackLimit(0)
  , learnCallback(0)

  , counter(0)

  , T(0)
  , inprocess_attempts(0)
  , inprocess_next_lim(opt_inprocessing_init_delay)
  , L(0)
  , inprocess_learnt_level(opt_inprocess_learnt_level)

  , inprocess_inc(opt_inprocessing_inc)
  , inprocess_penalty(opt_inprocessing_penalty)

  , max_learnts(0)
  , learntsize_adjust_confl(0)
  , learntsize_adjust_cnt(0)

  , VSIDS_props_limit(opt_VSIDS_props_limit)
  , VSIDS_props_init_limit(opt_VSIDS_props_init_limit)
  , switch_mode(false)

  // Resource constraints:
  //
  , conflict_budget(-1)
  , propagation_budget(-1)
  , asynch_interrupt(false)

  , prefetch_assumptions(opt_pref_assumpts)
  , last_used_assumptions(INT32_MAX)

  , buf_len(0)
  , buf_ptr(drup_buf)

  // simplfiy
  , trailRecord(0)
  , nbSimplifyAll(0)
  , simplified_length_record(0)
  , original_length_record(0)
  , s_propagations(0)
  , nr_lcm_duplicates(0)
  , simplifyBuffer(opt_dup_buffer_size)

  , share_parallel(true)
  , receiveClauses(true)
  , share_clause_max_size(64)
  , receivedCls(0)
  , learnedClsCallback(NULL)
  , consumeSharedCls(NULL)
  , issuer(NULL)
  , lastDecision(0)

  // simplifyAll adjust occasion
  , curSimplify(1)
  , nbconfbeforesimplify(opt_lcm_delay)
  , incSimplify(opt_lcm_delay_inc)
  , lcm(opt_lcm)
  , reverse_LCM(opt_reverse_lcm)
  , lcm_core(opt_lcm_core)
  , lcm_core_success(true) // start in the first round
  , LCM_total_tries(0)
  , LCM_successful_tries(0)
  , LCM_dropped_lits(0)
  , LCM_dropped_reverse(0)

  , nbcollectfirstuip(0)
  , nblearntclause(0)
  , nbDoubleConflicts(0)
  , nbTripleConflicts(0)
  , uip1(0)
  , uip2(0)

  , var_iLevel_inc(1)
  , my_var_decay(0.6)

  // for ccnr integration
  , use_ccnr(opt_use_ccnr)
  , allow_rephasing(opt_allow_rephasing)
  , restarts_gap(opt_ccnr_restarts_gap)
  , conflict_ratio(opt_ccnr_conflict_ratio)
  , percent_ratio(opt_ccnr_percent_ratio)
  , up_time_ratio(opt_ccnr_up_time_ratio)
  , ls_mems_num(opt_ccnr_ls_mems_num)
  , state_change_time(opt_ccnr_state_change_time)
  , state_change_time_inc(opt_ccnr_state_change_time_inc)
  , state_change_time_inc_inc(opt_ccnr_state_change_time_inc_inc)
  , mediation_used(opt_ccnr_mediation_used)
  , switch_heristic_mod(opt_ccnr_mediation_used)
  , last_switch_conflicts(0)
  , sls_var_lim(opt_sls_var_lim)
  , sls_clause_lim(opt_sls_clause_lim)

  , initial_sls(opt_sls_initial)
{
    if (opt_checkProofOnline && onlineDratChecker) {
        onlineDratChecker->setVerbosity(opt_checkProofOnline);
    }
}